

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CheckerInstantiationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CheckerInstantiationSyntax,slang::syntax::CheckerInstantiationSyntax_const&>
          (BumpAllocator *this,CheckerInstantiationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  ParameterValueAssignmentSyntax *pPVar3;
  Info *pIVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  CheckerInstantiationSyntax *pCVar9;
  
  pCVar9 = (CheckerInstantiationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CheckerInstantiationSyntax *)this->endPtr < pCVar9 + 1) {
    pCVar9 = (CheckerInstantiationSyntax *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(pCVar9 + 1);
  }
  (pCVar9->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar9->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar9->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pCVar9->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005dad10;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar9->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar9->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar9->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005dac60;
  pPVar3 = args->parameters;
  (pCVar9->type).ptr = (args->type).ptr;
  pCVar9->parameters = pPVar3;
  uVar5 = *(undefined4 *)&(args->instances).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->instances).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar9->instances).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->instances).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar9->instances).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pCVar9->instances).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar9->instances).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->instances).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar9->instances).super_SyntaxListBase.childCount =
       (args->instances).super_SyntaxListBase.childCount;
  (pCVar9->instances).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005db208;
  sVar2 = (args->instances).elements._M_extent._M_extent_value;
  (pCVar9->instances).elements._M_ptr = (args->instances).elements._M_ptr;
  (pCVar9->instances).elements._M_extent._M_extent_value = sVar2;
  uVar6 = (args->semi).field_0x2;
  NVar7.raw = (args->semi).numFlags.raw;
  uVar8 = (args->semi).rawLen;
  pIVar4 = (args->semi).info;
  (pCVar9->semi).kind = (args->semi).kind;
  (pCVar9->semi).field_0x2 = uVar6;
  (pCVar9->semi).numFlags = (NumericTokenFlags)NVar7.raw;
  (pCVar9->semi).rawLen = uVar8;
  (pCVar9->semi).info = pIVar4;
  return pCVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }